

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkDupDfs(Wlc_Ntk_t *p,int fMarked,int fSeq)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Wlc_Ntk_t *pNew_00;
  Wlc_Obj_t *pWVar5;
  Wlc_Obj_t *pWVar6;
  char *pcVar7;
  uint local_bc;
  int iObjNew;
  uint Type;
  int iFanin;
  int iObj;
  int k;
  int i;
  Vec_Int_t *vFanins;
  Wlc_Obj_t *pObjNew;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pNew;
  int fSeq_local;
  int fMarked_local;
  Wlc_Ntk_t *p_local;
  
  pVVar4 = Vec_IntAlloc(100);
  Wlc_NtkCleanCopy(p);
  pNew_00 = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  pNew_00->fSmtLib = p->fSmtLib;
  pNew_00->fAsyncRst = p->fAsyncRst;
  pNew_00->fMemPorts = p->fMemPorts;
  pNew_00->fEasyFfs = p->fEasyFfs;
  for (iObj = 0; iVar2 = Wlc_NtkCiNum(p), iObj < iVar2; iObj = iObj + 1) {
    pWVar5 = Wlc_NtkCi(p,iObj);
    if ((fMarked == 0) || ((*(ushort *)pWVar5 >> 7 & 1) != 0)) {
      uVar1 = *(ushort *)pWVar5;
      if (fSeq == 0) {
        *(ushort *)pWVar5 = *(ushort *)pWVar5 & 0xffc0 | 1;
      }
      iVar2 = Wlc_ObjId(p,pWVar5);
      Wlc_ObjDup(pNew_00,p,iVar2,pVVar4);
      *(ushort *)pWVar5 = *(ushort *)pWVar5 & 0xffc0 | uVar1 & 0x3f;
    }
  }
  for (iObj = 0; iVar2 = Vec_IntSize(&p->vFfs2), iObj < iVar2; iObj = iObj + 1) {
    pWVar5 = Wlc_NtkFf2(p,iObj);
    uVar1 = *(ushort *)pWVar5;
    iVar2 = Wlc_ObjIsSigned(pWVar5);
    iVar2 = Wlc_ObjAlloc(pNew_00,(uint)(uVar1 & 0x3f),iVar2,pWVar5->End,pWVar5->Beg);
    iVar3 = Wlc_ObjId(p,pWVar5);
    Wlc_ObjSetCopy(p,iVar3,iVar2);
    Vec_IntPush(&pNew_00->vFfs2,iVar2);
  }
  for (iObj = 0; iVar2 = Wlc_NtkCoNum(p), iObj < iVar2; iObj = iObj + 1) {
    pWVar5 = Wlc_NtkCo(p,iObj);
    if ((fMarked == 0) || ((*(ushort *)pWVar5 >> 7 & 1) != 0)) {
      iVar2 = Wlc_ObjId(p,pWVar5);
      Wlc_NtkDupDfs_rec(pNew_00,p,iVar2,pVVar4);
    }
  }
  for (iObj = 0; iVar2 = Wlc_NtkCoNum(p), iObj < iVar2; iObj = iObj + 1) {
    pWVar5 = Wlc_NtkCo(p,iObj);
    if ((fMarked == 0) || ((*(ushort *)pWVar5 >> 7 & 1) != 0)) {
      pWVar6 = Wlc_ObjCopyObj(pNew_00,p,pWVar5);
      if (fSeq == 0) {
        local_bc = 0;
      }
      else {
        local_bc = (uint)(*(ushort *)pWVar5 >> 10 & 1);
      }
      Wlc_ObjSetCo(pNew_00,pWVar6,local_bc);
    }
  }
  for (iObj = 0; iVar2 = Vec_IntSize(&p->vFfs2), iObj < iVar2; iObj = iObj + 1) {
    pWVar5 = Wlc_NtkFf2(p,iObj);
    iVar2 = Wlc_ObjId(p,pWVar5);
    for (iFanin = 0; iVar3 = Wlc_ObjFaninNum(pWVar5), iFanin < iVar3; iFanin = iFanin + 1) {
      iVar3 = Wlc_ObjFaninId(pWVar5,iFanin);
      Wlc_NtkDupDfs_rec(pNew_00,p,iVar3,pVVar4);
    }
    Wlc_ObjCollectCopyFanins(p,iVar2,pVVar4);
    iVar2 = Wlc_ObjCopy(p,iVar2);
    pWVar6 = Wlc_NtkObj(pNew_00,iVar2);
    Wlc_ObjAddFanins(pNew_00,pWVar6,pVVar4);
    *(ushort *)pWVar6 = *(ushort *)pWVar6 & 0xf7ff | (*(ushort *)pWVar5 >> 0xb & 1) << 0xb;
  }
  Vec_IntFree(pVVar4);
  if ((fSeq != 0) && (p->vInits != (Vec_Int_t *)0x0)) {
    if (fMarked == 0) {
      if (p->vInits != (Vec_Int_t *)0x0) {
        pVVar4 = Vec_IntDup(p->vInits);
        pNew_00->vInits = pVVar4;
      }
      if (p->pInits != (char *)0x0) {
        pcVar7 = Abc_UtilStrsav(p->pInits);
        pNew_00->pInits = pcVar7;
      }
    }
    else {
      if (p->vInits != (Vec_Int_t *)0x0) {
        pVVar4 = Wlc_ReduceMarkedInitVec(p,p->vInits);
        pNew_00->vInits = pVVar4;
      }
      if (p->pInits != (char *)0x0) {
        pcVar7 = Wlc_ReduceMarkedInitStr(p,p->pInits);
        pNew_00->pInits = pcVar7;
      }
    }
  }
  if (p->pSpec != (char *)0x0) {
    pcVar7 = Abc_UtilStrsav(p->pSpec);
    pNew_00->pSpec = pcVar7;
  }
  iVar2 = Wlc_NtkHasNameId(p);
  if (iVar2 != 0) {
    Wlc_NtkTransferNames(pNew_00,p);
  }
  iVar2 = Vec_IntSize(&p->vPoPairs);
  if (iVar2 != 0) {
    Vec_IntAppend(&pNew_00->vPoPairs,&p->vPoPairs);
  }
  return pNew_00;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfs( Wlc_Ntk_t * p, int fMarked, int fSeq )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj, * pObjNew;
    Vec_Int_t * vFanins;
    int i, k, iObj, iFanin;
    vFanins = Vec_IntAlloc( 100 );
    Wlc_NtkCleanCopy( p );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !fMarked || pObj->Mark )
        {
            unsigned Type = pObj->Type;
            if ( !fSeq ) pObj->Type = WLC_OBJ_PI;
            Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
            pObj->Type = Type;
        }
    Wlc_NtkForEachFf2( p, pObj, i )
    {
        int iObjNew = Wlc_ObjAlloc( pNew, pObj->Type, Wlc_ObjIsSigned(pObj), pObj->End, pObj->Beg );
        Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), iObjNew );
        Vec_IntPush( &pNew->vFfs2, iObjNew );
    }
    Wlc_NtkForEachCo( p, pObj, i )
        if ( !fMarked || pObj->Mark )
            Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( !fMarked || pObj->Mark )
            Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), fSeq ? pObj->fIsFi : 0 );
    Wlc_NtkForEachFf2( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Wlc_NtkDupDfs_rec( pNew, p, iFanin, vFanins );
        Wlc_ObjCollectCopyFanins( p, iObj, vFanins );
        pObjNew = Wlc_NtkObj( pNew, Wlc_ObjCopy(p, iObj) );
        Wlc_ObjAddFanins( pNew, pObjNew, vFanins );
        pObjNew->fXConst = pObj->fXConst;
    }
    Vec_IntFree( vFanins );
    if ( fSeq && p->vInits )
    {
        if ( fMarked )
        {
            if ( p->vInits )
                pNew->vInits = Wlc_ReduceMarkedInitVec( p, p->vInits );
            if ( p->pInits )
                pNew->pInits = Wlc_ReduceMarkedInitStr( p, p->pInits );
        }
        else
        {
            if ( p->vInits )
                pNew->vInits = Vec_IntDup( p->vInits );
            if ( p->pInits )
                pNew->pInits = Abc_UtilStrsav( p->pInits );
        }
    }
    if ( p->pSpec )
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Wlc_NtkHasNameId(p) )
        Wlc_NtkTransferNames( pNew, p );
    if ( Vec_IntSize(&p->vPoPairs) )
        Vec_IntAppend( &pNew->vPoPairs, &p->vPoPairs );
    return pNew;
}